

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

void Abc_NtkPartitionCompact(Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll,int nSuppSizeLimit)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int i;
  int i_00;
  
  iVar1 = 200;
  if (nSuppSizeLimit != 0) {
    iVar1 = nSuppSizeLimit;
  }
  i_00 = 0;
  i = 0;
  pVVar4 = (Vec_Int_t *)0x0;
  pVVar5 = (Vec_Int_t *)0x0;
  do {
    if (vPartSuppsAll->nSize <= i_00) {
      if (pVVar5 != (Vec_Int_t *)0x0) {
        Vec_PtrWriteEntry(vPartsAll,i,pVVar5);
        if (pVVar4 == (Vec_Int_t *)0x0) {
          __assert_fail("vPartSupp != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                        ,0x2bd,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
        }
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,i);
        Vec_IntFree(pVVar5);
        Vec_PtrWriteEntry(vPartSuppsAll,i,pVVar4);
        i = i + 1;
      }
      Vec_PtrShrink(vPartsAll,i);
      Vec_PtrShrink(vPartsAll,i);
      return;
    }
    pVVar2 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,i_00);
    if (pVVar2->nSize < iVar1) {
      if (pVVar4 == (Vec_Int_t *)0x0) {
        if (pVVar5 != (Vec_Int_t *)0x0) {
          __assert_fail("vPart == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                        ,0x29b,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
        }
        pVVar3 = Vec_IntDup(pVVar2);
        pVVar2 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,i_00);
      }
      else {
        pVVar3 = Vec_IntTwoMerge(pVVar4,pVVar2);
        Vec_IntFree(pVVar4);
        pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,i_00);
        pVVar2 = Vec_IntTwoMerge(pVVar5,pVVar4);
        Vec_IntFree(pVVar5);
        pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,i_00);
        Vec_IntFree(pVVar4);
      }
      pVVar4 = pVVar3;
      if (iVar1 <= pVVar3->nSize) goto LAB_002a41e2;
    }
    else {
      pVVar2 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,i_00);
LAB_002a41e2:
      Vec_PtrWriteEntry(vPartsAll,i,pVVar2);
      if (pVVar4 != (Vec_Int_t *)0x0) {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,i);
        Vec_IntFree(pVVar5);
        Vec_PtrWriteEntry(vPartSuppsAll,i,pVVar4);
      }
      i = i + 1;
      pVVar2 = (Vec_Int_t *)0x0;
      pVVar3 = (Vec_Int_t *)0x0;
    }
    i_00 = i_00 + 1;
    pVVar4 = pVVar3;
    pVVar5 = pVVar2;
  } while( true );
}

Assistant:

void Abc_NtkPartitionCompact( Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll, int nSuppSizeLimit )
{
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart;

    if ( nSuppSizeLimit == 0 )
        nSuppSizeLimit = 200;

    // pack smaller partitions into larger blocks
    iPart = 0;
    vPart = vPartSupp = NULL;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        if ( Vec_IntSize(vOne) < nSuppSizeLimit )
        {
            if ( vPartSupp == NULL )
            {
                assert( vPart == NULL );
                vPartSupp = Vec_IntDup(vOne);
                vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
            }
            else
            {
                vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
                Vec_IntFree( vTemp );
                vPart = Vec_IntTwoMerge( vTemp = vPart, (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
                Vec_IntFree( vTemp );
                Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
            }
            if ( Vec_IntSize(vPartSupp) < nSuppSizeLimit )
                continue;
        }
        else
            vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
        // add the partition 
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;
        if ( vPartSupp ) 
        {
            Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
            vPartSupp = NULL;
        }
        iPart++;
    }
    // add the last one
    if ( vPart )
    {
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;

        assert( vPartSupp != NULL );
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
        Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
        vPartSupp = NULL;
        iPart++;
    }
    Vec_PtrShrink( vPartsAll, iPart );
    Vec_PtrShrink( vPartsAll, iPart );
}